

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Psr_ManWriteVerilogSignal(FILE *pFile,Psr_Ntk_t *p,int Sig)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Psr_ManType_t Type;
  int Value;
  int Sig_local;
  Psr_Ntk_t *p_local;
  FILE *pFile_local;
  
  iVar1 = Abc_Lit2Var2(Sig);
  iVar2 = Abc_Lit2Att2(Sig);
  if ((iVar2 == 0) || (iVar2 == 2)) {
    pcVar3 = Psr_NtkStr(p,iVar1);
    fprintf((FILE *)pFile,"%s",pcVar3);
  }
  else if (iVar2 == 1) {
    iVar2 = Psr_SliceName(p,iVar1);
    pcVar3 = Psr_NtkStr(p,iVar2);
    iVar1 = Psr_SliceRange(p,iVar1);
    pcVar4 = Psr_NtkStr(p,iVar1);
    fprintf((FILE *)pFile,"%s%s",pcVar3,pcVar4);
  }
  else {
    if (iVar2 != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                    ,0x41,"void Psr_ManWriteVerilogSignal(FILE *, Psr_Ntk_t *, int)");
    }
    Psr_ManWriteVerilogConcat(pFile,p,iVar1);
  }
  return;
}

Assistant:

static void Psr_ManWriteVerilogSignal( FILE * pFile, Psr_Ntk_t * p, int Sig )
{
    int Value = Abc_Lit2Var2( Sig );
    Psr_ManType_t Type = (Psr_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == BAC_PRS_NAME || Type == BAC_PRS_CONST )
        fprintf( pFile, "%s", Psr_NtkStr(p, Value) );
    else if ( Type == BAC_PRS_SLICE )
        fprintf( pFile, "%s%s", Psr_NtkStr(p, Psr_SliceName(p, Value)), Psr_NtkStr(p, Psr_SliceRange(p, Value)) );
    else if ( Type == BAC_PRS_CONCAT )
        Psr_ManWriteVerilogConcat( pFile, p, Value );
    else assert( 0 );
}